

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usha.c
# Opt level: O2

int USHAHashSize(SHAversion whichSha)

{
  if (whichSha < SHA512) {
    return *(int *)(&DAT_0011bdc4 + (ulong)whichSha * 4);
  }
  return 0x40;
}

Assistant:

int USHAHashSize(enum SHAversion whichSha)
{
    switch (whichSha) {
    case SHA1:   return SHA1HashSize;
    case SHA224: return SHA224HashSize;
    case SHA256: return SHA256HashSize;
    case SHA384: return SHA384HashSize;
    default:
    case SHA512: return SHA512HashSize;
    }
}